

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O3

void writePrimalSolution<double>
               (SoPlexBase<double> *soplex,char *filename,NameSet *colnames,NameSet *rownames,
               bool real,bool rational,bool append)

{
  Tolerances *pTVar1;
  void *pvVar2;
  pointer pnVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  ostream *poVar8;
  long lVar9;
  long lVar10;
  undefined3 in_register_00000081;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  char *pcVar12;
  long lVar13;
  Real RVar14;
  undefined8 extraout_XMM0_Qb;
  VectorBase<double> primal;
  VectorRational primal_1;
  ofstream outfile;
  undefined1 auStack_2e8 [12];
  int local_2dc;
  Real local_2d8;
  NameSet *local_2d0;
  double local_2c8;
  undefined8 uStack_2c0;
  ulong local_2b0;
  longlong local_2a8;
  undefined4 local_29c;
  data_type local_298;
  undefined5 local_288;
  char cStack_283;
  char cStack_282;
  undefined1 uStack_281;
  uint local_278;
  void *local_270;
  char local_263;
  char local_262;
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  local_250;
  long local_238;
  long local_230;
  filebuf local_228 [8];
  double dStack_220;
  uint auStack_218 [56];
  ios_base local_138 [264];
  
  local_29c = CONCAT31(in_register_00000081,real);
  pTVar1 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var11 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
    }
  }
  RVar14 = ::soplex::Tolerances::epsilon(pTVar1);
  local_2c8 = log10(RVar14);
  uStack_2c0 = extraout_XMM0_Qb;
  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
  }
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)filename);
  local_2b0 = (ulong)(uint)(int)-local_2c8;
  local_2dc = (int)-local_2c8 + 10;
  local_2d0 = colnames;
  if ((char)rownames == '\0') goto LAB_0012dd7a;
  ::soplex::VectorBase<double>::VectorBase
            ((VectorBase<double> *)&local_298.ld,
             (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  bVar4 = ::soplex::SoPlexBase<double>::getPrimalRay(soplex,(VectorBase<double> *)&local_298.ld);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"\nPrimal ray (name, value):\n",0x1b);
    if (0 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
      lVar9 = (long)local_2dc;
      lVar10 = (long)(int)local_2b0;
      lVar13 = 0;
      do {
        local_2c8 = *(double *)(CONCAT44(local_298.la[0]._4_4_,local_298.ld.capacity) + lVar13 * 8);
        uStack_2c0 = 0;
        pTVar1 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var11 = (soplex->_tolerances).
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          }
        }
        RVar14 = ::soplex::Tolerances::epsilon(pTVar1);
        if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_2d8 = RVar14;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
          RVar14 = local_2d8;
        }
        if (RVar14 < ABS(local_2c8)) {
          if (local_2d0->mem == (char *)0x0) {
            std::ios::clear((int)auStack_2e8 + (int)*(undefined8 *)(local_230 + -0x18) + 0xb8);
          }
          else {
            pcVar12 = local_2d0->mem +
                      (local_2d0->set).theitem[(local_2d0->set).thekey[lVar13].idx].data;
            sVar7 = strlen(pcVar12);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar12,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
          *(long *)((long)&dStack_220 + *(long *)(local_230 + -0x18)) = lVar9;
          *(long *)(local_228 + *(long *)(local_230 + -0x18)) = lVar10;
          poVar8 = std::ostream::_M_insert<double>
                             (*(double *)
                               (CONCAT44(local_298.la[0]._4_4_,local_298.ld.capacity) + lVar13 * 8))
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                        thenum);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"All other entries are zero (within ",0x23);
    *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 1;
    *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
         *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xfffffefb | 0x100;
    pTVar1 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var11 = (soplex->_tolerances).
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
      }
    }
    RVar14 = ::soplex::Tolerances::epsilon(pTVar1);
    poVar8 = std::ostream::_M_insert<double>(RVar14);
    lVar9 = *(long *)poVar8;
    *(undefined8 *)(poVar8 + *(long *)(lVar9 + -0x18) + 8) = 8;
    lVar9 = *(long *)(lVar9 + -0x18);
    *(uint *)(poVar8 + lVar9 + 0x18) = *(uint *)(poVar8 + lVar9 + 0x18) & 0xfffffefb | 4;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,").",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
LAB_0012dd56:
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
    }
  }
  else {
    if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0x98 & 1) != 0)) ||
        ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 1) != 0)))) &&
       (bVar4 = ::soplex::SoPlexBase<double>::getPrimal(soplex,(VectorBase<double> *)&local_298.ld),
       bVar4)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"\nPrimal solution (name, value):\n",0x20);
      if ((soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum < 1) {
        iVar5 = 0;
      }
      else {
        local_238 = (long)local_2dc;
        lVar10 = (long)(int)local_2b0;
        lVar9 = 0;
        iVar5 = 0;
        do {
          local_2c8 = *(double *)(CONCAT44(local_298.la[0]._4_4_,local_298.ld.capacity) + lVar9 * 8)
          ;
          uStack_2c0 = 0;
          pTVar1 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var11 = (soplex->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
            }
          }
          RVar14 = ::soplex::Tolerances::epsilon(pTVar1);
          if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_2d8 = RVar14;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
            RVar14 = local_2d8;
          }
          if (RVar14 < ABS(local_2c8)) {
            if (local_2d0->mem == (char *)0x0) {
              std::ios::clear((int)auStack_2e8 + (int)*(undefined8 *)(local_230 + -0x18) + 0xb8);
            }
            else {
              pcVar12 = local_2d0->mem +
                        (local_2d0->set).theitem[(local_2d0->set).thekey[lVar9].idx].data;
              sVar7 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,pcVar12,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
            *(long *)((long)&dStack_220 + *(long *)(local_230 + -0x18)) = local_238;
            *(long *)(local_228 + *(long *)(local_230 + -0x18)) = lVar10;
            poVar8 = std::ostream::_M_insert<double>
                               (*(double *)
                                 (CONCAT44(local_298.la[0]._4_4_,local_298.ld.capacity) + lVar9 * 8)
                               );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            iVar5 = iVar5 + 1;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                         thenum);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"All other variables are zero (within ",0x25);
      *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 1;
      *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
           *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xfffffefb | 0x100;
      pTVar1 = (soplex->_tolerances).
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var11 = (soplex->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        }
      }
      RVar14 = ::soplex::Tolerances::epsilon(pTVar1);
      poVar8 = std::ostream::_M_insert<double>(RVar14);
      lVar9 = *(long *)poVar8;
      *(undefined8 *)(poVar8 + *(long *)(lVar9 + -0x18) + 8) = 8;
      lVar9 = *(long *)(lVar9 + -0x18);
      *(uint *)(poVar8 + lVar9 + 0x18) = *(uint *)(poVar8 + lVar9 + 0x18) & 0xfffffefb | 4;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"). Solution has ",0x10);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," nonzero entries.",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      goto LAB_0012dd56;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"No primal information available.\n",0x21);
  }
  pvVar2 = (void *)CONCAT44(local_298.la[0]._4_4_,local_298.ld.capacity);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,CONCAT17(uStack_281,CONCAT16(cStack_282,CONCAT15(cStack_283,local_288)))
                           - (long)pvVar2);
  }
LAB_0012dd7a:
  if ((char)local_29c != '\0') {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)&local_250,
                 (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
    bVar4 = ::soplex::SoPlexBase<double>::getPrimalRayRational
                      (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                               *)&local_250);
    if (bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"\nPrimal ray (name, value):\n",0x1b);
      if (0 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
        local_2c8 = (double)(long)local_2dc;
        local_2d8 = (Real)(long)(int)local_2b0;
        lVar10 = 0;
        lVar9 = 0;
        do {
          pnVar3 = local_250.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_2a8 = 0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_298.ld,&local_2a8,(type *)0x0);
          iVar5 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)((long)&(pnVar3->m_backend).m_value.num.m_backend.
                                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                       .m_data + lVar10),
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_298.ld);
          if ((local_263 == '\0') && (local_262 == '\0')) {
            operator_delete(local_270,(ulong)local_278 << 3);
          }
          if ((cStack_283 == '\0') && (cStack_282 == '\0')) {
            operator_delete(local_298.ld.data,(ulong)local_298.ld.capacity << 3);
          }
          if (iVar5 != 0) {
            if (local_2d0->mem == (char *)0x0) {
              std::ios::clear((int)auStack_2e8 + (int)*(undefined8 *)(local_230 + -0x18) + 0xb8);
            }
            else {
              pcVar12 = local_2d0->mem +
                        (local_2d0->set).theitem[(local_2d0->set).thekey[lVar9].idx].data;
              sVar7 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,pcVar12,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
            *(double *)((long)&dStack_220 + *(long *)(local_230 + -0x18)) = local_2c8;
            *(Real *)(local_228 + *(long *)(local_230 + -0x18)) = local_2d8;
            poVar8 = boost::multiprecision::operator<<
                               ((ostream *)&local_230,
                                (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                 *)((long)&((local_250.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                           m_value.num.m_backend.
                                           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                           .m_data + lVar10));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
          lVar9 = lVar9 + 1;
          lVar10 = lVar10 + 0x40;
        } while (lVar9 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                         thenum);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"All other entries are zero.",0x1b);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
    }
    if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0x98 & 1) != 0)) ||
        ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 1) != 0)))) &&
       (bVar4 = ::soplex::SoPlexBase<double>::getPrimalRational
                          (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   *)&local_250), bVar4)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"\nPrimal solution (name, value):\n",0x20);
      if ((soplex->_rationalLP->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .set.thenum < 1) {
        iVar5 = 0;
      }
      else {
        lVar10 = 0;
        lVar9 = 0;
        iVar5 = 0;
        do {
          pnVar3 = local_250.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_2a8 = 0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_298.ld,&local_2a8,(type *)0x0);
          iVar6 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)((long)&(pnVar3->m_backend).m_value.num.m_backend.
                                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                       .m_data + lVar10),
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_298.ld);
          if ((local_263 == '\0') && (local_262 == '\0')) {
            operator_delete(local_270,(ulong)local_278 << 3);
          }
          if ((cStack_283 == '\0') && (cStack_282 == '\0')) {
            operator_delete(local_298.ld.data,(ulong)local_298.ld.capacity << 3);
          }
          if (iVar6 != 0) {
            if (local_2d0->mem == (char *)0x0) {
              std::ios::clear((int)auStack_2e8 + (int)*(undefined8 *)(local_230 + -0x18) + 0xb8);
            }
            else {
              pcVar12 = local_2d0->mem +
                        (local_2d0->set).theitem[(local_2d0->set).thekey[lVar9].idx].data;
              sVar7 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,pcVar12,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
            poVar8 = boost::multiprecision::operator<<
                               ((ostream *)&local_230,
                                (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                 *)((long)&((local_250.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                           m_value.num.m_backend.
                                           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                           .m_data + lVar10));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            iVar5 = iVar5 + 1;
          }
          lVar9 = lVar9 + 1;
          lVar10 = lVar10 + 0x40;
        } while (lVar9 < (soplex->_rationalLP->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         .set.thenum);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"All other variables are zero. Solution has ",0x2b);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," nonzero entries.",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"No primal (rational) solution available.\n",0x29);
    }
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::~vector(&local_250);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

static
void writePrimalSolution(SoPlexBase<R>& soplex, const char* filename, NameSet& colnames,
                         NameSet& rownames,
                         bool real = true, bool rational = false, bool append = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;
   std::ofstream outfile;

   if(append)
      outfile.open(filename, std::ios::app);
   else
      outfile.open(filename);

   if(real)
   {
      VectorBase<R> primal(soplex.numCols());

      if(soplex.getPrimalRay(primal))
      {
         outfile <<  "\nPrimal ray (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
            }
         }

         outfile <<  "All other entries are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed
                 << ")." << std::endl;
      }
      else if(soplex.isPrimalFeasible() && soplex.getPrimal(primal))
      {
         int nNonzeros = 0;
         outfile <<  "\nPrimal solution (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
               ++nNonzeros;
            }
         }

         outfile <<  "All other variables are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed
                 << "). Solution has " << nNonzeros << " nonzero entries." << std::endl;
      }
      else
         outfile <<  "No primal information available.\n";
   }

   if(rational)
   {
      VectorRational primal(soplex.numCols());

      if(soplex.getPrimalRayRational(primal))
      {
         outfile <<  "\nPrimal ray (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
            }
         }

         outfile <<  "All other entries are zero." << std::endl;
      }

      if(soplex.isPrimalFeasible() && soplex.getPrimalRational(primal))
      {
         int nNonzeros = 0;
         outfile <<  "\nPrimal solution (name, value):\n";

         for(int i = 0; i < soplex.numColsRational(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               outfile <<  colnames[i] << "\t" << primal[i] << std::endl;
               ++nNonzeros;
            }
         }

         outfile <<  "All other variables are zero. Solution has "
                 << nNonzeros << " nonzero entries." << std::endl;
      }
      else
         outfile <<  "No primal (rational) solution available.\n";
   }
}